

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PortSymbols.cpp
# Opt level: O1

Symbol * __thiscall
slang::ast::anon_unknown_0::NonAnsiPortListBuilder::createPort
          (NonAnsiPortListBuilder *this,string_view externalName,SourceLocation externalLoc,
          PortReferenceSyntax *syntax)

{
  long lVar1;
  char *pcVar2;
  Scope *this_00;
  Compilation *this_01;
  ExpressionSyntax *pEVar3;
  uint uVar4;
  string_view arg;
  size_t __n;
  int iVar5;
  uint64_t uVar6;
  ulong uVar7;
  Diagnostic *pDVar8;
  PortSymbol *symbol;
  SourceLocation SVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  bool bVar17;
  undefined1 auVar18 [16];
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  char cVar23;
  char cVar24;
  char cVar25;
  char cVar26;
  char cVar27;
  char cVar28;
  char cVar29;
  char cVar30;
  char cVar31;
  char cVar32;
  char cVar33;
  char cVar34;
  SourceRange sourceRange;
  span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> attributes;
  LookupLocation lookupLocation;
  SourceLocation loc;
  string_view name;
  value_type *elements;
  bool local_c9;
  basic_string_view<char,_std::char_traits<char>_> local_c8;
  SourceLocation local_b0;
  string_view local_a8;
  SourceLocation local_98;
  NonAnsiPortListBuilder *local_90;
  PortReferenceSyntax *local_88;
  ulong local_80;
  ulong local_78;
  long local_70;
  ulong local_68;
  ulong local_60;
  long local_58;
  char *local_50;
  char local_48;
  char cStack_47;
  char cStack_46;
  char cStack_45;
  char cStack_44;
  char cStack_43;
  char cStack_42;
  char cStack_41;
  char cStack_40;
  char cStack_3f;
  char cStack_3e;
  char cStack_3d;
  char cStack_3c;
  char cStack_3b;
  char cStack_3a;
  char cStack_39;
  
  local_c8._M_str = externalName._M_str;
  local_c8._M_len = externalName._M_len;
  local_98 = externalLoc;
  local_a8 = parsing::Token::valueText(&syntax->name);
  if ((local_c8._M_len == 0) && (syntax->select == (ElementSelectSyntax *)0x0)) {
    local_c8._M_len = local_a8._M_len;
    local_c8._M_str = local_a8._M_str;
  }
  local_88 = syntax;
  uVar6 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                    ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                     &(this->portInfos).super_Storage.field_0x2c8,&local_a8);
  uVar12 = uVar6 >> ((this->portInfos).field_0x2d0 & 0x3f);
  lVar14 = *(long *)&(this->portInfos).field_0x2e0;
  lVar1 = (uVar6 & 0xff) * 4;
  cVar19 = (&UNK_0047c76c)[lVar1];
  cVar20 = (&UNK_0047c76d)[lVar1];
  cVar21 = (&UNK_0047c76e)[lVar1];
  cVar22 = (&UNK_0047c76f)[lVar1];
  local_58 = *(long *)&(this->portInfos).field_0x2e8;
  __n = local_a8._M_len;
  local_50 = local_a8._M_str;
  uVar7 = (ulong)((uint)uVar6 & 7);
  uVar11 = *(ulong *)&(this->portInfos).field_0x2d8;
  uVar16 = 0;
  cVar23 = cVar19;
  cVar24 = cVar20;
  cVar25 = cVar21;
  cVar26 = cVar22;
  cVar27 = cVar19;
  cVar28 = cVar20;
  cVar29 = cVar21;
  cVar30 = cVar22;
  cVar31 = cVar19;
  cVar32 = cVar20;
  cVar33 = cVar21;
  cVar34 = cVar22;
  do {
    pcVar2 = (char *)(lVar14 + uVar12 * 0x10);
    auVar18[0] = -(*pcVar2 == cVar19);
    auVar18[1] = -(pcVar2[1] == cVar20);
    auVar18[2] = -(pcVar2[2] == cVar21);
    auVar18[3] = -(pcVar2[3] == cVar22);
    auVar18[4] = -(pcVar2[4] == cVar23);
    auVar18[5] = -(pcVar2[5] == cVar24);
    auVar18[6] = -(pcVar2[6] == cVar25);
    auVar18[7] = -(pcVar2[7] == cVar26);
    auVar18[8] = -(pcVar2[8] == cVar27);
    auVar18[9] = -(pcVar2[9] == cVar28);
    auVar18[10] = -(pcVar2[10] == cVar29);
    auVar18[0xb] = -(pcVar2[0xb] == cVar30);
    auVar18[0xc] = -(pcVar2[0xc] == cVar31);
    auVar18[0xd] = -(pcVar2[0xd] == cVar32);
    auVar18[0xe] = -(pcVar2[0xe] == cVar33);
    auVar18[0xf] = -(pcVar2[0xf] == cVar34);
    uVar10 = (uint)(ushort)((ushort)(SUB161(auVar18 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar18 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar18 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar18 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar18 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar18 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar18 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar18 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar18 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar18 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar18 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar18 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar18 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar18 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar18 >> 0x77,0) & 1) << 0xe);
    uVar13 = uVar12;
    uVar15 = uVar16;
    if (uVar10 != 0) {
      local_80 = uVar16;
      local_78 = uVar11;
      local_70 = lVar14;
      local_60 = uVar7;
      local_90 = this;
      local_68 = uVar12;
      lVar1 = local_58 + uVar12 * 0x528;
      local_48 = cVar19;
      cStack_47 = cVar20;
      cStack_46 = cVar21;
      cStack_45 = cVar22;
      cStack_44 = cVar23;
      cStack_43 = cVar24;
      cStack_42 = cVar25;
      cStack_41 = cVar26;
      cStack_40 = cVar27;
      cStack_3f = cVar28;
      cStack_3e = cVar29;
      cStack_3d = cVar30;
      cStack_3c = cVar31;
      cStack_3b = cVar32;
      cStack_3a = cVar33;
      cStack_39 = cVar34;
      do {
        uVar4 = 0;
        if (uVar10 != 0) {
          for (; (uVar10 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
          }
        }
        bVar17 = __n == *(size_t *)(lVar1 + (ulong)uVar4 * 0x58);
        lVar14 = lVar1 + (ulong)uVar4 * 0x58;
        if (bVar17 && __n != 0) {
          iVar5 = bcmp(local_50,*(void **)(lVar14 + 8),__n);
          bVar17 = iVar5 == 0;
          cVar19 = local_48;
          cVar20 = cStack_47;
          cVar21 = cStack_46;
          cVar22 = cStack_45;
          cVar23 = cStack_44;
          cVar24 = cStack_43;
          cVar25 = cStack_42;
          cVar26 = cStack_41;
          cVar27 = cStack_40;
          cVar28 = cStack_3f;
          cVar29 = cStack_3e;
          cVar30 = cStack_3d;
          cVar31 = cStack_3c;
          cVar32 = cStack_3b;
          cVar33 = cStack_3a;
          cVar34 = cStack_39;
        }
        this = local_90;
        if (bVar17) goto LAB_0013f8db;
        uVar10 = uVar10 - 1 & uVar10;
        uVar7 = local_60;
        uVar11 = local_78;
        uVar13 = local_68;
        lVar14 = local_70;
        uVar15 = local_80;
      } while (uVar10 != 0);
    }
    if ((*(byte *)(uVar12 * 0x10 + lVar14 + 0xf) &
        (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
          is_not_overflowed(unsigned_long)::shift)[uVar7]) == 0) break;
    uVar16 = uVar15 + 1;
    uVar12 = uVar13 + uVar15 + 1 & uVar11;
  } while (uVar16 <= uVar11);
  lVar14 = 0;
LAB_0013f8db:
  if (lVar14 == 0) {
    if (local_a8._M_len != 0) {
      pDVar8 = Scope::addDiag(this->scope,(DiagCode)0x7e0006,local_98);
      Diagnostic::operator<<(pDVar8,local_a8);
    }
    local_b0 = (SourceLocation)((ulong)local_b0 & 0xffffffffffffff00);
    symbol = BumpAllocator::
             emplace<slang::ast::PortSymbol,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation&,bool>
                       (&this->comp->super_BumpAllocator,&local_c8,&local_98,(bool *)&local_b0);
    symbol->type = this->comp->errorType;
  }
  else {
    *(undefined1 *)(lVar14 + 0x54) = 1;
    local_b0 = parsing::Token::location((Token *)(*(long *)(lVar14 + 0x10) + 0x18));
    if (*(char *)(lVar14 + 0x55) == '\x01') {
      if (local_c8._M_len == 0) {
        local_c8._M_len = local_a8._M_len;
        local_c8._M_str = local_a8._M_str;
      }
      if (local_88->select != (ElementSelectSyntax *)0x0) {
        this_00 = this->scope;
        sourceRange = slang::syntax::SyntaxNode::sourceRange(&local_88->select->super_SyntaxNode);
        pDVar8 = Scope::addDiag(this_00,(DiagCode)0x450006,sourceRange);
        arg._M_str = local_c8._M_str;
        arg._M_len = local_c8._M_len;
        Diagnostic::operator<<(pDVar8,arg);
      }
      symbol = (PortSymbol *)
               BumpAllocator::
               emplace<slang::ast::InterfacePortSymbol,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation&>
                         (&this->comp->super_BumpAllocator,&local_c8,&local_b0);
      (symbol->super_Symbol).originatingSyntax = *(SyntaxNode **)(lVar14 + 0x10);
      symbol->internalSymbol = &(*(DefinitionSymbol **)(lVar14 + 0x38))->super_Symbol;
      pcVar2 = *(char **)(lVar14 + 0x48);
      ((string_view *)&symbol->externalLoc)->_M_len = *(size_t *)(lVar14 + 0x40);
      *(char **)&symbol->direction = pcVar2;
      if (*(long *)(lVar14 + 0x30) != 0) {
        this_01 = this->comp;
        lookupLocation.index = *(undefined4 *)(*(long *)(lVar14 + 0x30) + 0x30);
        lookupLocation.scope = this->scope;
        lookupLocation._12_4_ = 0;
        attributes = AttributeSymbol::fromSyntax
                               (*(span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>
                                  *)(lVar14 + 0x18),this->scope,lookupLocation);
        Compilation::setAttributes(this_01,(Symbol *)symbol,attributes);
      }
    }
    else {
      local_c9 = false;
      symbol = BumpAllocator::
               emplace<slang::ast::PortSymbol,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation&,bool>
                         (&this->comp->super_BumpAllocator,&local_c8,&local_b0,&local_c9);
      (symbol->super_Symbol).originatingSyntax = (SyntaxNode *)local_88;
      symbol->externalLoc = local_98;
      symbol->direction = *(ArgumentDirection *)(lVar14 + 0x50);
      symbol->internalSymbol = *(Symbol **)(lVar14 + 0x28);
      lVar1 = *(long *)(*(long *)(lVar14 + 0x10) + 0x60);
      if (lVar1 != 0) {
        pEVar3 = *(ExpressionSyntax **)(lVar1 + 0x28);
        SVar9 = parsing::Token::location((Token *)(lVar1 + 0x18));
        symbol->initializerSyntax = pEVar3;
        symbol->initializerLoc = SVar9;
      }
    }
  }
  return &symbol->super_Symbol;
}

Assistant:

Symbol& createPort(std::string_view externalName, SourceLocation externalLoc,
                       const PortReferenceSyntax& syntax) {
        auto name = syntax.name.valueText();
        if (externalName.empty() && !syntax.select)
            externalName = name;

        auto it = portInfos.find(name);
        if (it == portInfos.end()) {
            if (!name.empty())
                scope.addDiag(diag::MissingPortIODeclaration, externalLoc) << name;

            auto port = comp.emplace<PortSymbol>(externalName, externalLoc, /* isAnsiPort */ false);
            port->setType(comp.getErrorType());
            return *port;
        }

        auto& info = it->second;
        info.used = true;

        auto loc = info.syntax->name.location();
        if (info.isIface) {
            // Interface ports should not have empty names. We'll be ignoring the
            // select if there is one (along with issuing an error) so just set the name.
            if (externalName.empty())
                externalName = name;

            if (syntax.select) {
                auto& diag = scope.addDiag(diag::IfacePortInExpr, syntax.select->sourceRange());
                diag << externalName;
            }

            auto port = comp.emplace<InterfacePortSymbol>(externalName, loc);
            port->setSyntax(*info.syntax);
            port->interfaceDef = info.ifaceDef;
            port->modport = info.modport;

            if (info.insertionPoint) {
                comp.setAttributes(
                    *port, AttributeSymbol::fromSyntax(
                               info.attrs, scope,
                               LookupLocation(&scope, (uint32_t)info.insertionPoint->getIndex())));
            }

            return *port;
        }

        auto port = comp.emplace<PortSymbol>(externalName, loc, /* isAnsiPort */ false);
        port->setSyntax(syntax);
        port->externalLoc = externalLoc;

        SLANG_ASSERT(info.internalSymbol);
        port->direction = info.direction;
        port->internalSymbol = info.internalSymbol;

        if (auto init = info.syntax->initializer)
            port->setInitializerSyntax(*init->expr, init->equals.location());

        return *port;
    }